

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

TString * luaS_createlngstrobj(lua_State *L,size_t l)

{
  TString *pTVar1;
  
  pTVar1 = createstrobj(L,l,0x14,L->l_G->seed);
  (pTVar1->u).lnglen = l;
  pTVar1->shrlen = 0xff;
  return pTVar1;
}

Assistant:

TString *luaS_createlngstrobj (lua_State *L, size_t l) {
  TString *ts = createstrobj(L, l, LUA_VLNGSTR, G(L)->seed);
  ts->u.lnglen = l;
  ts->shrlen = 0xFF;  /* signals that it is a long string */
  return ts;
}